

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O1

bool __thiscall llbuild::ninja::Rule::isValidParameterName(Rule *this,StringRef name)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = name.Data;
  bVar3 = false;
  pcVar1 = pcVar2 + -4;
  switch(pcVar1) {
  case (char *)0x0:
switchD_00131782_caseD_0:
    if (*(int *)&(this->name)._M_dataplus._M_p == 0x73706564) {
      return true;
    }
    bVar3 = false;
    switch(pcVar1) {
    case (char *)0x0:
switchD_001317ab_caseD_0:
      if (*(int *)&(this->name)._M_dataplus._M_p == 0x6c6f6f70) {
        return true;
      }
      if (pcVar2 != (char *)0xf) {
        if (pcVar2 != (char *)0x7) {
          if (pcVar2 != (char *)0x6) {
            return false;
          }
          goto switchD_00131782_caseD_2;
        }
        goto switchD_00131854_caseD_3;
      }
      break;
    default:
      goto switchD_00131782_caseD_1;
    case (char *)0x2:
      goto switchD_00131782_caseD_2;
    case (char *)0x3:
switchD_00131820_caseD_3:
      if (*(int *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x656c6966 &&
          *(int *)&(this->name)._M_dataplus._M_p == 0x66706564) {
        return true;
      }
      bVar3 = false;
      switch(pcVar1) {
      case (char *)0x0:
        goto switchD_001317ab_caseD_0;
      default:
        goto switchD_00131782_caseD_1;
      case (char *)0x2:
        goto switchD_00131782_caseD_2;
      case (char *)0x3:
        goto switchD_00131854_caseD_3;
      case (char *)0x5:
        goto switchD_00131782_caseD_5;
      case (char *)0xb:
        break;
      }
    case (char *)0x5:
      goto switchD_00131782_caseD_5;
    case (char *)0xb:
      break;
    }
    break;
  default:
    goto switchD_00131782_caseD_1;
  case (char *)0x2:
switchD_00131782_caseD_2:
    if (*(short *)((long)&(this->name)._M_dataplus._M_p + 4) == 0x7461 &&
        *(int *)&(this->name)._M_dataplus._M_p == 0x74736572) {
      return true;
    }
    if (pcVar2 != (char *)0xf) {
      if (pcVar2 != (char *)0x7) {
        return false;
      }
switchD_00131854_caseD_3:
      if (*(int *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x656c6966 &&
          *(int *)&(this->name)._M_dataplus._M_p == 0x66707372) {
        return true;
      }
      if (pcVar2 != (char *)0xf) {
        return false;
      }
    }
    break;
  case (char *)0x3:
    if (*(int *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x646e616d &&
        *(int *)&(this->name)._M_dataplus._M_p == 0x6d6d6f63) {
      return true;
    }
    bVar3 = false;
    switch(pcVar1) {
    case (char *)0x0:
      goto switchD_00131782_caseD_0;
    default:
      goto switchD_00131782_caseD_1;
    case (char *)0x2:
      goto switchD_00131782_caseD_2;
    case (char *)0x3:
      goto switchD_00131820_caseD_3;
    case (char *)0x5:
      goto switchD_00131782_caseD_5;
    case (char *)0x7:
      goto switchD_00131782_caseD_7;
    case (char *)0xb:
      break;
    }
  case (char *)0x5:
switchD_00131782_caseD_5:
    if ((char)(this->name)._M_string_length == 'r' &&
        (this->name)._M_dataplus._M_p == (pointer)0x6f746172656e6567) {
      return true;
    }
    if ((long)pcVar2 < 7) {
      if (pcVar2 == (char *)0x4) goto switchD_001317ab_caseD_0;
      if (pcVar2 != (char *)0x6) {
        return false;
      }
      goto switchD_00131782_caseD_2;
    }
    if (pcVar2 == (char *)0x7) goto switchD_00131854_caseD_3;
    if (pcVar2 != (char *)0xf) {
      return false;
    }
    break;
  case (char *)0x7:
switchD_00131782_caseD_7:
    if (*(long *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x6e6f697470697263 &&
        (this->name)._M_dataplus._M_p == (pointer)0x7470697263736564) {
      return true;
    }
    bVar3 = false;
    switch(pcVar1) {
    case (char *)0x0:
      goto switchD_00131782_caseD_0;
    default:
      goto switchD_00131782_caseD_1;
    case (char *)0x2:
      goto switchD_00131782_caseD_2;
    case (char *)0x3:
      goto switchD_00131820_caseD_3;
    case (char *)0x5:
      goto switchD_00131782_caseD_5;
    case (char *)0xb:
      break;
    }
  case (char *)0xb:
    break;
  }
  bVar3 = *(long *)((long)&(this->name)._M_dataplus._M_p + 7) == 0x746e65746e6f635f &&
          (this->name)._M_dataplus._M_p == (pointer)0x5f656c6966707372;
switchD_00131782_caseD_1:
  return bVar3;
}

Assistant:

bool Rule::isValidParameterName(StringRef name) {
  return name == "command" ||
    name == "description" ||
    name == "deps" ||
    name == "depfile" ||
    name == "generator" ||
    name == "pool" ||
    name == "restat" ||
    name == "rspfile" ||
    name == "rspfile_content";
}